

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::push
          (stack<c4::yml::Parser::State,_16UL> *this,State *n)

{
  Location loc;
  bool bVar1;
  error_flags eVar2;
  void *in_RSI;
  long in_RDI;
  undefined1 in_stack_00000000 [24];
  size_t cap;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  stack<c4::yml::Parser::State,_16UL> *in_stack_ffffffffffffffa0;
  char *local_28;
  stack<c4::yml::Parser::State,_16UL> *in_stack_ffffffffffffffe0;
  long lVar3;
  
  if ((*(ulong *)(in_RDI + 0x980) <= (long)in_RSI + 0x98U) &&
     (in_RSI <= (void *)(*(long *)(in_RDI + 0x980) + *(long *)(in_RDI + 0x990) * 0x98))) {
    lVar3 = in_RDI;
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location((Location *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                       in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffe0;
    loc.super_LineCol.line = lVar3;
    loc.super_LineCol.offset = (size_t)in_RSI;
    loc._16_24_ = in_stack_00000000;
    error<94ul>((char (*) [94])in_stack_ffffffffffffffa0,loc);
    in_stack_ffffffffffffff98 = local_28;
  }
  if (*(long *)(in_RDI + 0x988) == *(long *)(in_RDI + 0x990)) {
    reserve(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
  }
  memcpy((void *)(*(long *)(in_RDI + 0x980) + *(long *)(in_RDI + 0x988) * 0x98),in_RSI,0x98);
  *(long *)(in_RDI + 0x988) = *(long *)(in_RDI + 0x988) + 1;
  return;
}

Assistant:

void push(T const& C4_RESTRICT n)
    {
        RYML_ASSERT((const char*)&n + sizeof(T) < (const char*)m_stack || &n > m_stack + m_capacity);
        if(m_size == m_capacity)
        {
            size_t cap = m_capacity == 0 ? N : 2 * m_capacity;
            reserve(cap);
        }
        m_stack[m_size] = n;
        ++m_size;
    }